

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

uchar ** traverse<vector_block<unsigned_char*,1024u>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  uint uVar1;
  TrieNode<unsigned_char> *node_00;
  _func_void_uchar_ptr_ptr_int_int *p_Var2;
  size_t __n;
  uchar **__dest;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  do {
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar4];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        p_Var2 = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[0];
        small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
        lVar3 = (long)small_sort - (long)p_Var2;
        if (small_sort == p_Var2) {
          __assert_fail("not v._index_block.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                        ,0x5b,
                        "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                       );
        }
        uVar1 = *(uint *)((node_00->buckets)._M_elems + 4);
        __dest = dst;
        if (8 < (ulong)((long)small_sort - (long)p_Var2)) {
          uVar5 = 1;
          do {
            memmove(__dest,*(void **)(p_Var2 + uVar5 * 8 + -8),0x2000);
            __dest = __dest + 0x400;
            uVar5 = uVar5 + 1;
            p_Var2 = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[0];
            small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
          } while (uVar5 < (ulong)((long)small_sort - (long)p_Var2 >> 3));
        }
        __n = (long)(node_00->buckets)._M_elems[3] - (long)*(void **)(small_sort + -8);
        if (__n != 0) {
          memmove(__dest,*(void **)(small_sort + -8),__n);
        }
        lVar3 = lVar3 * 0x80 - (ulong)uVar1;
        if (uVar4 != 0) {
          mkqsort(dst,(int)lVar3,(int)depth);
        }
        dst = dst + lVar3;
        vector_block<unsigned_char_*,_1024U>::~vector_block
                  ((vector_block<unsigned_char_*,_1024U> *)node_00);
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_block<unsigned_char*,1024u>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  if (node != (TrieNode<unsigned_char> *)0x0) {
    operator_delete(node);
  }
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}